

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

void __thiscall
btAlignedObjectArray<btSoftBody::RContact>::push_back
          (btAlignedObjectArray<btSoftBody::RContact> *this,RContact *_Val)

{
  btScalar *pbVar1;
  RContact *pRVar2;
  btCollisionObject *pbVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  int _Count;
  
  iVar7 = this->m_size;
  if (iVar7 == this->m_capacity) {
    _Count = 1;
    if (iVar7 != 0) {
      _Count = iVar7 * 2;
    }
    reserve(this,_Count);
    iVar7 = this->m_size;
  }
  pRVar2 = this->m_data;
  pRVar2[iVar7].m_node = _Val->m_node;
  pbVar3 = (_Val->m_cti).m_colObj;
  uVar4 = *(undefined8 *)(_Val->m_cti).m_normal.m_floats;
  uVar5 = *(undefined8 *)&(_Val->m_cti).m_offset;
  pbVar1 = pRVar2[iVar7].m_cti.m_normal.m_floats + 2;
  *(undefined8 *)pbVar1 = *(undefined8 *)((_Val->m_cti).m_normal.m_floats + 2);
  *(undefined8 *)(pbVar1 + 2) = uVar5;
  pRVar2[iVar7].m_cti.m_colObj = pbVar3;
  *(undefined8 *)pRVar2[iVar7].m_cti.m_normal.m_floats = uVar4;
  uVar4 = *(undefined8 *)((_Val->m_c0).m_el[0].m_floats + 2);
  *(undefined8 *)pRVar2[iVar7].m_c0.m_el[0].m_floats = *(undefined8 *)(_Val->m_c0).m_el[0].m_floats;
  *(undefined8 *)(pRVar2[iVar7].m_c0.m_el[0].m_floats + 2) = uVar4;
  uVar4 = *(undefined8 *)((_Val->m_c0).m_el[1].m_floats + 2);
  *(undefined8 *)pRVar2[iVar7].m_c0.m_el[1].m_floats = *(undefined8 *)(_Val->m_c0).m_el[1].m_floats;
  *(undefined8 *)(pRVar2[iVar7].m_c0.m_el[1].m_floats + 2) = uVar4;
  uVar4 = *(undefined8 *)((_Val->m_c0).m_el[2].m_floats + 2);
  *(undefined8 *)pRVar2[iVar7].m_c0.m_el[2].m_floats = *(undefined8 *)(_Val->m_c0).m_el[2].m_floats;
  *(undefined8 *)(pRVar2[iVar7].m_c0.m_el[2].m_floats + 2) = uVar4;
  uVar4 = *(undefined8 *)((_Val->m_c1).m_floats + 2);
  uVar5 = *(undefined8 *)((_Val->m_c1).m_floats + 3);
  uVar6 = *(undefined8 *)&_Val->m_c3;
  *(undefined8 *)pRVar2[iVar7].m_c1.m_floats = *(undefined8 *)(_Val->m_c1).m_floats;
  *(undefined8 *)(pRVar2[iVar7].m_c1.m_floats + 2) = uVar4;
  pbVar1 = pRVar2[iVar7].m_c1.m_floats + 3;
  *(undefined8 *)pbVar1 = uVar5;
  *(undefined8 *)(pbVar1 + 2) = uVar6;
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

SIMD_FORCE_INLINE	void push_back(const T& _Val)
		{	
			const BT_REGISTER int sz = size();
			if( sz == capacity() )
			{
				reserve( allocSize(size()) );
			}
			
#ifdef BT_USE_PLACEMENT_NEW
			new ( &m_data[m_size] ) T(_Val);
#else
			m_data[size()] = _Val;			
#endif //BT_USE_PLACEMENT_NEW

			m_size++;
		}